

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_encryption.cc
# Opt level: O2

bool check_user_password(string *user_password,EncryptionData *data)

{
  bool bVar1;
  int iVar2;
  string u_value;
  string local_30;
  
  if (data->V < 5) {
    compute_U_value(&local_30,user_password,data);
    iVar2 = bcmp((data->U)._M_dataplus._M_p,local_30._M_dataplus._M_p,
                 (ulong)(data->R < 3) * 0x10 + 0x10);
    std::__cxx11::string::~string((string *)&local_30);
    return iVar2 == 0;
  }
  bVar1 = check_user_password_V5(user_password,data);
  return bVar1;
}

Assistant:

static bool
check_user_password(std::string const& user_password, QPDF::EncryptionData const& data)
{
    if (data.getV() < 5) {
        return check_user_password_V4(user_password, data);
    } else {
        return check_user_password_V5(user_password, data);
    }
}